

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall Arcflow::Arcflow(Arcflow *this,char *fname)

{
  clock_t cVar1;
  runtime_error *this_00;
  char local_128 [8];
  char _error_msg_ [256];
  char *fname_local;
  Arcflow *this_local;
  
  std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::set(&this->AS);
  NodeSet::NodeSet(&this->NS);
  std::vector<int,_std::allocator<int>_>::vector(&this->maxW);
  std::
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::map(&this->dp);
  std::vector<int,_std::allocator<int>_>::vector(&this->max_label);
  std::vector<int,_std::allocator<int>_>::vector(&this->hash_bits);
  std::vector<int,_std::allocator<int>_>::vector(&this->max_rep);
  std::vector<Item,_std::allocator<Item>_>::vector(&this->sitems);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->weights);
  Instance::Instance(&this->inst);
  std::vector<int,_std::allocator<int>_>::vector(&this->Ts);
  std::vector<Arc,_std::allocator<Arc>_>::vector(&this->A);
  this->ready = false;
  cVar1 = clock();
  this->tstart = cVar1;
  init(this,(EVP_PKEY_CTX *)fname);
  if ((this->ready & 1U) != 1) {
    snprintf(local_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == true",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1b);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_128);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Arcflow::Arcflow(const char *fname) {
	ready = false;
	tstart = CURTIME;
	init(fname);
	throw_assert(ready == true);
}